

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::AddMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  cmState *this_00;
  int iVar1;
  char *__nptr;
  float prog;
  float fVar2;
  allocator local_41;
  cmMakefile *local_40;
  string local_38;
  
  local_40 = mf;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&local_40);
  this_00 = this->CMakeInstance->State;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_NUMBER_OF_MAKEFILES",&local_41);
  __nptr = cmState::GetInitializedCacheValue(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (__nptr == (char *)0x0) {
    fVar2 = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    prog = 0.95;
    if (fVar2 <= 0.95) {
      prog = fVar2;
    }
    this->FirstTimeProgress = prog;
  }
  else {
    iVar1 = atoi(__nptr);
    fVar2 = ((float)(ulong)((long)(this->Makefiles).
                                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->Makefiles).
                                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) * 0.9) /
            (float)iVar1;
    prog = 0.9;
    if (fVar2 <= 0.9) {
      prog = fVar2;
    }
  }
  cmake::UpdateProgress(this->CMakeInstance,"Configuring",prog);
  return;
}

Assistant:

void cmGlobalGenerator::AddMakefile(cmMakefile *mf)
{
  this->Makefiles.push_back(mf);

  // update progress
  // estimate how many lg there will be
  const char *numGenC =
    this->CMakeInstance->GetState()->GetInitializedCacheValue
    ("CMAKE_NUMBER_OF_MAKEFILES");

  if (!numGenC)
    {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) /30.0f);
    if(this->FirstTimeProgress > 0.95f)
      {
      this->FirstTimeProgress = 0.95f;
      }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
    }

  int numGen = atoi(numGenC);
  float prog = 0.9f*static_cast<float>(this->Makefiles.size())/
    static_cast<float>(numGen);
  if (prog > 0.9f)
    {
    prog = 0.9f;
    }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}